

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

int64 __thiscall TTD::EventLog::GetPreviousSnapshotInterval(EventLog *this,int64 currentSnapTime)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  SnapshotEventLogEntry *pSVar3;
  SnapshotEventLogEntry *snapEvent;
  EventLogEntry *evt;
  Iterator iter;
  int64 currentSnapTime_local;
  EventLog *this_local;
  
  iter.m_previousEventMap =
       (BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)currentSnapTime;
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)&evt,&this->m_eventList);
  do {
    bVar1 = TTEventList::Iterator::IsValid((Iterator *)&evt);
    if (!bVar1) {
      this_local = (EventLog *)&DAT_ffffffffffffffff;
      return (int64)this_local;
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
    if (pEVar2->EventKind == SnapshotTag) {
      pEVar2 = TTEventList::Iterator::Current((Iterator *)&evt);
      pSVar3 = NSLogEvents::
               GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                         (pEVar2);
      if (pSVar3->RestoreTimestamp < (long)iter.m_previousEventMap) {
        return pSVar3->RestoreTimestamp;
      }
    }
    TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)&evt);
  } while( true );
}

Assistant:

int64 EventLog::GetPreviousSnapshotInterval(int64 currentSnapTime) const
    {
        //move the iterator to the current snapshot just before the event
        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            NSLogEvents::EventLogEntry* evt = iter.Current();
            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                if(snapEvent->RestoreTimestamp < currentSnapTime)
                {
                    return snapEvent->RestoreTimestamp;
                }
            }
        }

        return -1;
    }